

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECDecoding.cpp
# Opt level: O0

SeqEntry * __thiscall
ECdecoding::decode(ECdecoding *this,int codewordLen,unordered_map<string,_vector<string>_> *motif,
                  json *config)

{
  iterator iter;
  ostream *key;
  ostream *poVar1;
  void *this_00;
  long in_RSI;
  SeqEntry *in_RDI;
  logic_error *e_2;
  logic_error *e_1;
  iterator itr;
  logic_error *e;
  SeqEntry baseLine;
  SeqEntry sequence;
  Deflate ac;
  BitOutStream bitOut;
  DecodedData dec;
  char2double nextProbs;
  ProbabilityEval currSeq;
  string s;
  array<double,_2UL> fanoMetrics;
  array<int,_2UL> e_rate;
  int itCount;
  array<char,_4UL> bases;
  SeqEntry *res;
  SeqEntry *__x;
  undefined4 in_stack_ffffffffffffef50;
  int in_stack_ffffffffffffef54;
  DecodedData *in_stack_ffffffffffffef58;
  BitOutStream *in_stack_ffffffffffffef60;
  undefined4 in_stack_ffffffffffffef68;
  int in_stack_ffffffffffffef6c;
  undefined4 in_stack_ffffffffffffef70;
  int in_stack_ffffffffffffef74;
  undefined4 in_stack_ffffffffffffef78;
  int in_stack_ffffffffffffef7c;
  SeqEntry *in_stack_ffffffffffffef80;
  undefined4 in_stack_ffffffffffffef88;
  int in_stack_ffffffffffffef8c;
  ECdecoding *in_stack_ffffffffffffef90;
  array<double,_2UL> *in_stack_ffffffffffffef98;
  ECdecoding *in_stack_ffffffffffffefa0;
  double in_stack_ffffffffffffefa8;
  pair<int,_SeqEntry> *in_stack_ffffffffffffefb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffefb8;
  Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_SeqEntry>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffefc0;
  char *in_stack_fffffffffffff018;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_fffffffffffff020;
  ProbabilityEval *in_stack_fffffffffffff0e8;
  allocator<char> local_701 [1385];
  undefined1 local_198 [16];
  undefined8 local_188;
  _Type local_48;
  int local_38;
  int local_34;
  int local_30;
  undefined4 local_2c;
  
  local_2c = 0x47435441;
  local_30 = 0;
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::operator[]<char_const>(in_stack_fffffffffffff020,in_stack_fffffffffffff018);
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::operator[]<char_const>(in_stack_fffffffffffff020,in_stack_fffffffffffff018);
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::operator[]<char_const>(in_stack_fffffffffffff020,in_stack_fffffffffffff018);
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::operator[]<char_const>(in_stack_fffffffffffff020,in_stack_fffffffffffff018);
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::operator[]<char_const>(in_stack_fffffffffffff020,in_stack_fffffffffffff018);
  local_38 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator_int<int,_0>
                       ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)0x16b13f);
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::operator[]<char_const>(in_stack_fffffffffffff020,in_stack_fffffffffffff018);
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::operator[]<char_const>(in_stack_fffffffffffff020,in_stack_fffffffffffff018);
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::operator[]<char_const>(in_stack_fffffffffffff020,in_stack_fffffffffffff018);
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::operator[]<char_const>(in_stack_fffffffffffff020,in_stack_fffffffffffff018);
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::operator[]<char_const>(in_stack_fffffffffffff020,in_stack_fffffffffffff018);
  local_34 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator_int<int,_0>
                       ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)0x16b1a2);
  local_48 = (_Type)getFanos((double)in_stack_ffffffffffffef60,
                             (array<int,_2UL> *)in_stack_ffffffffffffef58);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffef60);
  __x = *(SeqEntry **)(in_RSI + 0x1e0);
  ProbabilityEval::ProbabilityEval
            ((ProbabilityEval *)in_stack_ffffffffffffef90,
             (string *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88),
             (string2stringVec *)in_stack_ffffffffffffef80,in_stack_ffffffffffffef7c,
             SUB41((uint)in_stack_ffffffffffffef78 >> 0x18,0),in_stack_ffffffffffffef74,
             (unordered_map<string,_char2double> *)in_stack_ffffffffffffefa0);
  ProbabilityEval::nextProbsSingleLetter(in_stack_fffffffffffff0e8);
  local_198 = (undefined1  [16])0x0;
  local_188 = 0;
  DecodedData::DecodedData((DecodedData *)0x16b278);
  DecodedData::DecodedData
            ((DecodedData *)CONCAT44(in_stack_ffffffffffffef54,in_stack_ffffffffffffef50),
             (DecodedData *)__x);
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::operator[]<char_const>(in_stack_fffffffffffff020,in_stack_fffffffffffff018);
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::operator[]<char_const>(in_stack_fffffffffffff020,in_stack_fffffffffffff018);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator_int<int,_0>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)0x16b2d8);
  BitOutStream::BitOutStream
            (in_stack_ffffffffffffef60,in_stack_ffffffffffffef58,in_stack_ffffffffffffef54);
  DecodedData::~DecodedData((DecodedData *)0x16b30c);
  BitOutStream::BitOutStream
            ((BitOutStream *)CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70),
             (BitOutStream *)CONCAT44(in_stack_ffffffffffffef6c,in_stack_ffffffffffffef68));
  Deflate::Deflate((Deflate *)CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70),
                   in_stack_ffffffffffffef6c,in_stack_ffffffffffffef60);
  BitOutStream::~BitOutStream
            ((BitOutStream *)CONCAT44(in_stack_ffffffffffffef54,in_stack_ffffffffffffef50));
  Deflate::Deflate((Deflate *)CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70),
                   (Deflate *)CONCAT44(in_stack_ffffffffffffef6c,in_stack_ffffffffffffef68));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffef90,
             (char *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88),
             (allocator<char> *)in_stack_ffffffffffffef80);
  SeqEntry::SeqEntry((SeqEntry *)in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8,
                     (string *)in_stack_ffffffffffffefa0,
                     (int)((ulong)in_stack_ffffffffffffef98 >> 0x20),
                     (Deflate *)in_stack_ffffffffffffef90,
                     (FreqTable *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88),
                     (string *)in_stack_ffffffffffffef80);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffef54,in_stack_ffffffffffffef50));
  std::allocator<char>::~allocator(local_701);
  Deflate::~Deflate((Deflate *)CONCAT44(in_stack_ffffffffffffef54,in_stack_ffffffffffffef50));
  SeqEntry::SeqEntry(in_stack_ffffffffffffef80,
                     (SeqEntry *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78));
  std::pair<int,_SeqEntry>::pair<int,_SeqEntry_&,_true>
            ((pair<int,_SeqEntry> *)CONCAT44(in_stack_ffffffffffffef54,in_stack_ffffffffffffef50),
             (int *)__x,(SeqEntry *)0x16b47b);
  robin_hood::detail::
  Table<false,80ul,std::__cxx11::string,std::pair<int,SeqEntry>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
  ::emplace<std::__cxx11::string&,std::pair<int,SeqEntry>>
            (in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb0);
  std::pair<int,_SeqEntry>::~pair((pair<int,_SeqEntry> *)0x16b4b1);
  metricProbs(in_stack_ffffffffffffef90,
              (SeqEntry *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88),
              (array<double,_2UL> *)in_stack_ffffffffffffef80,
              (char2double *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
              (array<char,_4UL> *)CONCAT44(in_stack_ffffffffffffef74,in_stack_ffffffffffffef70));
  mainLoop(in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98,
           (array<char,_4UL> *)in_stack_ffffffffffffef90,in_stack_ffffffffffffef8c);
  key = std::operator<<((ostream *)&std::cout,"[+] ");
  poVar1 = std::operator<<(key,"Finished first run, checking CRC...");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  absl::container_internal::
  btree_container<absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_>
  ::begin((btree_container<absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_>
           *)CONCAT44(in_stack_ffffffffffffef54,in_stack_ffffffffffffef50));
  absl::container_internal::
  btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_&,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_*>
  ::operator*((btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_&,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_*>
               *)CONCAT44(in_stack_ffffffffffffef54,in_stack_ffffffffffffef50));
  std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>::operator*
            ((unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_> *)
             CONCAT44(in_stack_ffffffffffffef54,in_stack_ffffffffffffef50));
  SeqEntry::SeqEntry(in_stack_ffffffffffffef80,
                     (SeqEntry *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78));
  iter.node_._4_4_ = in_stack_ffffffffffffef6c;
  iter.node_._0_4_ = in_stack_ffffffffffffef68;
  iter.position_ = in_stack_ffffffffffffef70;
  iter._12_4_ = in_stack_ffffffffffffef74;
  absl::container_internal::
  btree_container<absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_>
  ::erase((btree_container<absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_>
           *)in_stack_ffffffffffffef60,iter);
  while ((*(byte *)(in_RSI + 0x48) & 1) != 0) {
    *(undefined1 *)(in_RSI + 0x48) = 0;
    Deflate::finish((Deflate *)CONCAT44(in_stack_ffffffffffffef54,in_stack_ffffffffffffef50));
    poVar1 = std::operator<<((ostream *)&std::cout,"[+] ");
    poVar1 = std::operator<<(poVar1,"CRC SUCCESSFUL in iteration: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_30);
    poVar1 = std::operator<<(poVar1," metric ");
    this_00 = (void *)std::ostream::operator<<(poVar1,in_RDI->metric);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::operator[]<char_const>(in_stack_fffffffffffff020,(char *)key);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::operator[]<char_const>(in_stack_fffffffffffff020,(char *)key);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::operator[]<char_const>(in_stack_fffffffffffff020,(char *)key);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator_unsigned_long<unsigned_long,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)0x16bad4);
    checkCandidate((ECdecoding *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88),
                   in_stack_ffffffffffffef80,
                   CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78));
    SeqEntry::operator=((SeqEntry *)CONCAT44(in_stack_ffffffffffffef54,in_stack_ffffffffffffef50),
                        __x);
    SeqEntry::~SeqEntry((SeqEntry *)CONCAT44(in_stack_ffffffffffffef54,in_stack_ffffffffffffef50));
  }
  SeqEntry::~SeqEntry((SeqEntry *)CONCAT44(in_stack_ffffffffffffef54,in_stack_ffffffffffffef50));
  SeqEntry::~SeqEntry((SeqEntry *)CONCAT44(in_stack_ffffffffffffef54,in_stack_ffffffffffffef50));
  Deflate::~Deflate((Deflate *)CONCAT44(in_stack_ffffffffffffef54,in_stack_ffffffffffffef50));
  BitOutStream::~BitOutStream
            ((BitOutStream *)CONCAT44(in_stack_ffffffffffffef54,in_stack_ffffffffffffef50));
  DecodedData::~DecodedData((DecodedData *)0x16be90);
  robin_hood::detail::
  Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::~Table
            ((Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_> *)
             0x16be9d);
  ProbabilityEval::~ProbabilityEval
            ((ProbabilityEval *)CONCAT44(in_stack_ffffffffffffef54,in_stack_ffffffffffffef50));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffef54,in_stack_ffffffffffffef50));
  return in_RDI;
}

Assistant:

SeqEntry ECdecoding::decode(int codewordLen, robin_hood::unordered_map<string, vector<string>> &motif, nlohmann::json &config) {
    array<char, 4> bases{'A', 'T', 'C', 'G'};
    int itCount = 0;
    array<int, 2> e_rate = {config["decode"]["metric"]["fano"]["rate"]["low"],config["decode"]["metric"]["fano"]["rate"]["high"]};
    array<double, 2> fanoMetrics = getFanos(errorProb, e_rate);
    string s;
    ProbabilityEval currSeq = ProbabilityEval(s, motif, 0, true, codewordLen, &probMap);
    char2double nextProbs = currSeq.nextProbsSingleLetter();
    DecodedData dec = DecodedData();
    BitOutStream bitOut = BitOutStream(dec, config["general"]["sync"]);
    Deflate ac = Deflate(16, bitOut);
    SeqEntry sequence = SeqEntry(0.0, currSeq.seq, 0, ac, frequencyMap);
    //put in the empty sequence in the crcCheckpoint map as a last-resort
    SeqEntry baseLine = sequence;
    crcCheckpoints.emplace(baseLine.seq, std::pair(0, baseLine));
    metricProbs(sequence, fanoMetrics, nextProbs, bases);
    try {
        mainLoop(fanoMetrics, bases, itCount);
    } catch (const logic_error &e) {
        WARN(e.what());
        SeqEntry res = **queue.begin();
        res.metric = 1000;
        return res;
    }
    SUCCESS("Finished first run, checking CRC...");
    auto itr = queue.begin();
    SeqEntry res = **itr;
    queue.erase(itr);
    while (endFailed) {
        try {
            endFailed = false;
            res.ac.finish();
            SUCCESS("CRC SUCCESSFUL in iteration: " << itCount << " metric " << res.metric);
            res = checkCandidate(res, config["decode"]["threshold"]["finish"]);
        } catch (const logic_error &e) {
            INFO("CRC FAILED in iteration: " << itCount);
            endFailed = true;
            try {
                mainLoop(fanoMetrics, bases, itCount);
            } catch (const logic_error &e) {
                WARN(e.what());
                res.metric = 1000;
                return res;
            }
            itr = queue.begin();
            res = **itr;
            queue.erase(itr);
            itCount++;
        }
    }
    return res;
}